

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  WavParser *this;
  TestFileType in_EDX;
  string Path;
  
  WavParserHelper::GetTestFilePath_abi_cxx11_(&Path,(WavParserHelper *)0x4,in_EDX);
  this = (WavParser *)operator_new(0x34);
  WavParser::WavParser(this);
  iVar1 = (*this->_vptr_WavParser[2])(this,&Path);
  if ((char)iVar1 != '\0') {
    (*this->_vptr_WavParser[3])(this);
  }
  std::istream::get();
  (*this->_vptr_WavParser[1])(this);
  std::__cxx11::string::~string((string *)&Path);
  return 0;
}

Assistant:

int main()
{
	std::string Path = WavParserHelper::GetTestFilePath(TestFileType::Int16Stereo);

	auto MyParser = new WavParser();

	if (MyParser->LoadFile(Path))
	{
		MyParser->Parse();
	}

	std::cin.get();

	delete MyParser;
	return 0;
}